

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O2

bool mg::data::nxgx_compress(string_view *in,string *out)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *__format;
  char *local_90;
  ulong local_88;
  undefined8 uStack_80;
  pointer local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = (pointer)0x0;
  uStack_70 = 0;
  uStack_80 = 0;
  local_28 = 0;
  local_88 = in->_M_len & 0xffffffff;
  local_90 = in->_M_str;
  std::__cxx11::string::resize((ulong)out);
  uStack_70 = CONCAT44(uStack_70._4_4_,(int)out->_M_string_length);
  local_78 = (out->_M_dataplus)._M_p + 0x10;
  local_68 = 0;
  iVar3 = deflateInit2_(&local_90,0xffffffffffffffff,8,0x1f,8,0);
  if (iVar3 == 0) {
    uVar4 = deflate(&local_90,4,0x70,"1.2.11");
    uVar2 = local_68;
    if (uVar4 < 2) {
      uVar4 = deflateEnd();
      if (uVar4 < 2) {
        pcVar1 = (out->_M_dataplus)._M_p;
        *(int *)(pcVar1 + 4) = (int)in->_M_len;
        *(int *)(pcVar1 + 8) = (int)uVar2;
        pcVar1[0] = 'N';
        pcVar1[1] = 'X';
        pcVar1[2] = 'G';
        pcVar1[3] = 'X';
        std::__cxx11::string::resize((ulong)out);
        return true;
      }
      __format = "zlib deflateEnd error: %d: %s\n";
    }
    else {
      __format = "zlib deflate error: %d: %s\n";
    }
    uVar5 = (ulong)uVar4;
  }
  else {
    __format = "zlib init error: %d: %s\n";
    uVar5 = 1;
  }
  fprintf(_stderr,__format,uVar5,uStack_60);
  return false;
}

Assistant:

bool nxgx_compress(const std::string_view &in, std::string &out) {
  // Create stream context
  z_stream dstream{};
  dstream.avail_in = in.size();
  dstream.next_in =
      const_cast<uint8_t *>(reinterpret_cast<const uint8_t *>(in.data()));

  // Default output to same size as input + size of header
  out.resize(in.size() + sizeof(Nxx));

  // Set the output start to be past the end of the reserved header area
  dstream.avail_out = out.size();
  dstream.next_out = reinterpret_cast<uint8_t *>(out.data() + sizeof(Nxx));
  dstream.total_out = 0;

  // Init deflate context
  if (int err = deflateInit2(&dstream, -1, 8, 15 + 16, 8, 0) != Z_OK) {
    fprintf(stderr, "zlib init error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Perform deflate
  int err = deflate(&dstream, Z_FINISH);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib deflate error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Get the final compressed size
  const int compressed_size = dstream.total_out;

  err = deflateEnd(&dstream);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib deflateEnd error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Write the header
  Nxx *header = reinterpret_cast<Nxx *>(out.data());
  header->size = in.size();
  header->compressed_size = compressed_size;
  memcpy(header->magic, MAGIC_NXGX, sizeof(header->magic));
  header->to_file_order();

  // Shrunk output buffer to wrap
  out.resize(sizeof(Nxx) + compressed_size);

  return true;
}